

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall TArray<vertex_t,_vertex_t>::Resize(TArray<vertex_t,_vertex_t> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  vertex_t *pvVar3;
  long lVar4;
  long lVar5;
  
  uVar2 = this->Count;
  if (amount < uVar2 || amount - uVar2 == 0) {
    if (amount != 0 && uVar2 == 0) {
      __assert_fail("last != ~0u",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                    ,0x1b2,
                    "void TArray<vertex_t>::DoDelete(unsigned int, unsigned int) [T = vertex_t, TT = vertex_t]"
                   );
    }
  }
  else {
    Grow(this,amount - uVar2);
    uVar2 = this->Count;
    if (uVar2 < amount) {
      lVar5 = (ulong)uVar2 * 0x38 + 0x28;
      lVar4 = (ulong)amount - (ulong)uVar2;
      do {
        pvVar3 = this->Array;
        *(undefined8 *)((long)pvVar3 + lVar5 + -0x18) = 0;
        puVar1 = (undefined8 *)((long)pvVar3 + lVar5 + -0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)pvVar3 + lVar5 + -0x10) = 1;
        *(undefined8 *)((long)pvVar3 + lVar5 + -0xc) = 0;
        puVar1 = (undefined8 *)((long)&(pvVar3->p).X + lVar5);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar5 = lVar5 + 0x38;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}